

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O2

void __thiscall
ASN1Test_MissingRequiredField_Test::TestBody(ASN1Test_MissingRequiredField_Test *this)

{
  long lVar1;
  REQUIRED_FIELD *pRVar2;
  char *pcVar3;
  char *in_R9;
  long lVar4;
  AssertHelper local_80;
  AssertionResult gtest_ar_;
  AssertHelper local_68;
  unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)> obj;
  AssertionResult gtest_ar;
  
  obj._M_t.super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>._M_t.
  super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>.
  super__Tuple_impl<1UL,_void_(*)(REQUIRED_FIELD_*)>.
  super__Head_base<1UL,_void_(*)(REQUIRED_FIELD_*),_false>._M_head_impl._0_4_ = 0xffffffff;
  gtest_ar_._0_4_ = i2d_REQUIRED_FIELD((REQUIRED_FIELD *)0x0,(uchar **)0x0);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"-1","i2d_REQUIRED_FIELD(nullptr, nullptr)",(int *)&obj,
             (int *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&obj);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0xa98,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&obj);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (obj._M_t.super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>._M_t.
        super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>.
        super__Tuple_impl<1UL,_void_(*)(REQUIRED_FIELD_*)>.
        super__Head_base<1UL,_void_(*)(REQUIRED_FIELD_*),_false>._M_head_impl !=
        (_func_void_REQUIRED_FIELD_ptr *)0x0) {
      (**(code **)(*(long *)obj._M_t.
                            super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>._M_t.
                            super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>.
                            super__Tuple_impl<1UL,_void_(*)(REQUIRED_FIELD_*)>.
                            super__Head_base<1UL,_void_(*)(REQUIRED_FIELD_*),_false>._M_head_impl +
                  8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  obj._M_t.super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>._M_t.
  super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>.
  super__Tuple_impl<1UL,_void_(*)(REQUIRED_FIELD_*)>.
  super__Head_base<1UL,_void_(*)(REQUIRED_FIELD_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(REQUIRED_FIELD_*),_false>)REQUIRED_FIELD_free;
  obj._M_t.super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>._M_t.
  super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>.
  super__Head_base<0UL,_REQUIRED_FIELD_*,_false>._M_head_impl = (REQUIRED_FIELD *)0x0;
  for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 8) {
    lVar1 = *(long *)((long)&DAT_0048f488 + lVar4);
    pRVar2 = REQUIRED_FIELD_new();
    std::__uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>::reset
              ((__uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)> *)&obj,pRVar2);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         obj._M_t.super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>._M_t.
         super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>.
         super__Head_base<0UL,_REQUIRED_FIELD_*,_false>._M_head_impl != (REQUIRED_FIELD *)0x0;
    if (obj._M_t.super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>._M_t.
        super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>.
        super__Head_base<0UL,_REQUIRED_FIELD_*,_false>._M_head_impl == (REQUIRED_FIELD *)0x0) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x4e1809,"false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xa9f,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
      goto LAB_001c4253;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    ASN1_INTEGER_free(*(ASN1_INTEGER **)
                       ((long)&(obj._M_t.
                                super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>.
                                _M_t.
                                super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>
                                .super__Head_base<0UL,_REQUIRED_FIELD_*,_false>._M_head_impl)->value
                       + lVar1));
    *(undefined8 *)
     ((long)&(obj._M_t.super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>._M_t.
              super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>.
              super__Head_base<0UL,_REQUIRED_FIELD_*,_false>._M_head_impl)->value + lVar1) = 0;
    gtest_ar_.success_ = true;
    gtest_ar_._1_3_ = 0xffffff;
    local_80.data_._0_4_ =
         i2d_REQUIRED_FIELD(obj._M_t.
                            super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>._M_t.
                            super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>.
                            super__Head_base<0UL,_REQUIRED_FIELD_*,_false>._M_head_impl,
                            (uchar **)0x0);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"-1","i2d_REQUIRED_FIELD(obj.get(), nullptr)",(int *)&gtest_ar_
               ,(int *)&local_80);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar3 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xaa2,pcVar3);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 8) {
    lVar1 = *(long *)((long)&DAT_0048f4a0 + lVar4);
    pRVar2 = REQUIRED_FIELD_new();
    std::__uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>::reset
              ((__uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)> *)&obj,pRVar2);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         obj._M_t.super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>._M_t.
         super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>.
         super__Head_base<0UL,_REQUIRED_FIELD_*,_false>._M_head_impl != (REQUIRED_FIELD *)0x0;
    if (obj._M_t.super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>._M_t.
        super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>.
        super__Head_base<0UL,_REQUIRED_FIELD_*,_false>._M_head_impl == (REQUIRED_FIELD *)0x0) {
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x4e1809,"false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xaa8,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
      goto LAB_001c4253;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    sk_ASN1_INTEGER_pop_free
              (*(stack_st_ASN1_INTEGER **)
                ((long)&(obj._M_t.super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>.
                         _M_t.super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>.
                         super__Head_base<0UL,_REQUIRED_FIELD_*,_false>._M_head_impl)->value + lVar1
                ),ASN1_INTEGER_free);
    *(undefined8 *)
     ((long)&(obj._M_t.super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>._M_t.
              super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>.
              super__Head_base<0UL,_REQUIRED_FIELD_*,_false>._M_head_impl)->value + lVar1) = 0;
    gtest_ar_.success_ = true;
    gtest_ar_._1_3_ = 0xffffff;
    local_80.data_._0_4_ =
         i2d_REQUIRED_FIELD(obj._M_t.
                            super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>._M_t.
                            super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>.
                            super__Head_base<0UL,_REQUIRED_FIELD_*,_false>._M_head_impl,
                            (uchar **)0x0);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"-1","i2d_REQUIRED_FIELD(obj.get(), nullptr)",(int *)&gtest_ar_
               ,(int *)&local_80);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar3 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xaab,pcVar3);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
  }
  lVar4 = 0;
  while( true ) {
    if (lVar4 == 0x18) goto LAB_001c4281;
    lVar1 = *(long *)((long)&DAT_0048f4b8 + lVar4);
    pRVar2 = REQUIRED_FIELD_new();
    std::__uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>::reset
              ((__uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)> *)&obj,pRVar2);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         obj._M_t.super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>._M_t.
         super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>.
         super__Head_base<0UL,_REQUIRED_FIELD_*,_false>._M_head_impl != (REQUIRED_FIELD *)0x0;
    if (obj._M_t.super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>._M_t.
        super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>.
        super__Head_base<0UL,_REQUIRED_FIELD_*,_false>._M_head_impl == (REQUIRED_FIELD *)0x0) break;
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    *(undefined8 *)
     ((long)&(obj._M_t.super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>._M_t.
              super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>.
              super__Head_base<0UL,_REQUIRED_FIELD_*,_false>._M_head_impl)->value + lVar1) = 0;
    gtest_ar_.success_ = true;
    gtest_ar_._1_3_ = 0xffffff;
    local_80.data_._0_4_ =
         i2d_REQUIRED_FIELD(obj._M_t.
                            super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>._M_t.
                            super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>.
                            super__Head_base<0UL,_REQUIRED_FIELD_*,_false>._M_head_impl,
                            (uchar **)0x0);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"-1","i2d_REQUIRED_FIELD(obj.get(), nullptr)",(int *)&gtest_ar_
               ,(int *)&local_80);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar3 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xab3,pcVar3);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    lVar4 = lVar4 + 8;
  }
  testing::Message::Message((Message *)&local_80);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x4e1809,"false","true",
             in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_68,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
             ,0xab1,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_80);
LAB_001c4253:
  testing::internal::AssertHelper::~AssertHelper(&local_68);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if ((long *)CONCAT44(local_80.data_._4_4_,(int)local_80.data_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_80.data_._4_4_,(int)local_80.data_) + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
LAB_001c4281:
  std::unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>::~unique_ptr(&obj);
  return;
}

Assistant:

TEST(ASN1Test, MissingRequiredField) {
  EXPECT_EQ(-1, i2d_REQUIRED_FIELD(nullptr, nullptr));

  std::unique_ptr<REQUIRED_FIELD, decltype(&REQUIRED_FIELD_free)> obj(
      nullptr, REQUIRED_FIELD_free);
  for (auto field : {&REQUIRED_FIELD::value, &REQUIRED_FIELD::value_imp,
                     &REQUIRED_FIELD::value_exp}) {
    obj.reset(REQUIRED_FIELD_new());
    ASSERT_TRUE(obj);
    ASN1_INTEGER_free((*obj).*field);
    (*obj).*field = nullptr;
    EXPECT_EQ(-1, i2d_REQUIRED_FIELD(obj.get(), nullptr));
  }

  for (auto field : {&REQUIRED_FIELD::seq, &REQUIRED_FIELD::seq_imp,
                     &REQUIRED_FIELD::seq_exp}) {
    obj.reset(REQUIRED_FIELD_new());
    ASSERT_TRUE(obj);
    sk_ASN1_INTEGER_pop_free((*obj).*field, ASN1_INTEGER_free);
    (*obj).*field = nullptr;
    EXPECT_EQ(-1, i2d_REQUIRED_FIELD(obj.get(), nullptr));
  }

  for (auto field : {&REQUIRED_FIELD::null, &REQUIRED_FIELD::null_imp,
                     &REQUIRED_FIELD::null_exp}) {
    obj.reset(REQUIRED_FIELD_new());
    ASSERT_TRUE(obj);
    (*obj).*field = nullptr;
    EXPECT_EQ(-1, i2d_REQUIRED_FIELD(obj.get(), nullptr));
  }
}